

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

ImWchar * ImStb::stb_text_createundo(StbUndoState *state,int pos,int insert_len,int delete_len)

{
  short sVar1;
  int iVar2;
  StbUndoRecord *pSVar3;
  
  state->redo_point = 99;
  state->redo_char_point = 999;
  if (state->undo_point == 99) {
    stb_textedit_discard_undo(state);
  }
  if (insert_len < 1000) {
    iVar2 = state->undo_char_point;
    while (999 < iVar2 + insert_len) {
      stb_textedit_discard_undo(state);
      iVar2 = state->undo_char_point;
    }
    sVar1 = state->undo_point;
    state->undo_point = sVar1 + 1;
    pSVar3 = state->undo_rec + sVar1;
  }
  else {
    state->undo_point = 0;
    state->undo_char_point = 0;
    pSVar3 = (StbUndoRecord *)0x0;
  }
  if (pSVar3 != (StbUndoRecord *)0x0) {
    pSVar3->where = pos;
    pSVar3->insert_length = insert_len;
    pSVar3->delete_length = delete_len;
    if (insert_len != 0) {
      iVar2 = state->undo_char_point;
      pSVar3->char_storage = iVar2;
      state->undo_char_point = insert_len + iVar2;
      return state->undo_char + iVar2;
    }
    pSVar3->char_storage = -1;
  }
  return (ImWchar *)0x0;
}

Assistant:

static STB_TEXTEDIT_CHARTYPE *stb_text_createundo(StbUndoState *state, int pos, int insert_len, int delete_len)
{
   StbUndoRecord *r = stb_text_create_undo_record(state, insert_len);
   if (r == NULL)
      return NULL;

   r->where = pos;
   r->insert_length = (STB_TEXTEDIT_POSITIONTYPE) insert_len;
   r->delete_length = (STB_TEXTEDIT_POSITIONTYPE) delete_len;

   if (insert_len == 0) {
      r->char_storage = -1;
      return NULL;
   } else {
      r->char_storage = state->undo_char_point;
      state->undo_char_point += insert_len;
      return &state->undo_char[r->char_storage];
   }
}